

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O1

void idwpt_sym(wpt_object wt,double *cA,int len_cA,double *cD,double *X)

{
  wave_object pwVar1;
  double *pdVar2;
  double *pdVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  if (0 < len_cA) {
    pwVar1 = wt->wave;
    iVar6 = pwVar1->hpr_len + pwVar1->lpr_len;
    iVar5 = pwVar1->hpr_len + pwVar1->lpr_len + 3;
    if (-1 < iVar6) {
      iVar5 = iVar6;
    }
    lVar10 = -1;
    lVar9 = -2;
    uVar4 = 0;
    do {
      X[lVar9 + 2] = 0.0;
      lVar9 = lVar9 + 2;
      X[lVar10 + 2] = 0.0;
      lVar10 = lVar10 + 2;
      if (3 < iVar6) {
        lVar7 = 4;
        lVar8 = 0;
        do {
          if ((uint)((int)uVar4 + (int)lVar8) < (uint)len_cA) {
            pdVar2 = pwVar1->lpr;
            pdVar3 = pwVar1->hpr;
            X[lVar9] = *(double *)((long)pdVar2 + lVar7 * 2 + -8) * cA[lVar8] +
                       *(double *)((long)pdVar3 + lVar7 * 2 + -8) * cD[lVar8] + X[lVar9];
            X[lVar10] = *(double *)((long)pdVar2 + lVar7 * 2) * cA[lVar8] +
                        *(double *)((long)pdVar3 + lVar7 * 2) * cD[lVar8] + X[lVar10];
          }
          lVar8 = lVar8 + -1;
          lVar7 = lVar7 + 8;
        } while (-lVar8 != (ulong)(uint)(iVar5 >> 2));
      }
      uVar4 = uVar4 + 1;
      cD = cD + 1;
      cA = cA + 1;
    } while (uVar4 != (uint)len_cA);
  }
  return;
}

Assistant:

static void idwpt_sym(wpt_object wt, double *cA, int len_cA, double *cD, double *X) {
	int len_avg, i, l, m, n, t, v;

	len_avg = (wt->wave->lpr_len + wt->wave->hpr_len) / 2;
	m = -2;
	n = -1;

	for (v = 0; v < len_cA; ++v) {
		i = v;
		m += 2;
		n += 2;
		X[m] = 0.0;
		X[n] = 0.0;
		for (l = 0; l < len_avg / 2; ++l) {
			t = 2 * l;
			if ((i - l) >= 0 && (i - l) < len_cA) {
				X[m] += wt->wave->lpr[t] * cA[i - l] + wt->wave->hpr[t] * cD[i - l];
				X[n] += wt->wave->lpr[t + 1] * cA[i - l] + wt->wave->hpr[t + 1] * cD[i - l];
			}
		}
	}
}